

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O0

uint * Kit_DsdTruthComputeNodeTwo_rec
                 (Kit_DsdMan_t *p,Kit_DsdNtk_t *pNtk,int Id,uint uSupp,int iVar,uint *pTruthDec)

{
  ushort uVar1;
  CloudManager *dd;
  uint uVar2;
  int iVar3;
  uint uVar4;
  Kit_DsdObj_t *pObj_00;
  uint *puVar5;
  uint local_134;
  uint uSuppCur;
  uint uSuppFan;
  uint nPartial;
  uint fCompl;
  uint iLit;
  uint i;
  uint *pTruthTemp;
  uint *pTruthFans [16];
  uint *pTruthRes;
  int pfBoundSet [16];
  Kit_DsdObj_t *pObj;
  uint *pTruthDec_local;
  int iVar_local;
  uint uSupp_local;
  int Id_local;
  Kit_DsdNtk_t *pNtk_local;
  Kit_DsdMan_t *p_local;
  
  if (uSupp == 0) {
    __assert_fail("uSupp > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                  ,0x35d,
                  "unsigned int *Kit_DsdTruthComputeNodeTwo_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int, int, unsigned int *)"
                 );
  }
  pObj_00 = Kit_DsdNtkObj(pNtk,Id);
  p_local = (Kit_DsdMan_t *)Vec_PtrEntry(p->vTtNodes,Id);
  if (pObj_00 == (Kit_DsdObj_t *)0x0) {
    if ((int)(uint)pNtk->nVars <= Id) {
      __assert_fail("Id < pNtk->nVars",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                    ,0x364,
                    "unsigned int *Kit_DsdTruthComputeNodeTwo_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int, int, unsigned int *)"
                   );
    }
  }
  else {
    if (((uint)*pObj_00 >> 6 & 7) == 1) {
      __assert_fail("pObj->Type != KIT_DSD_CONST1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                    ,0x367,
                    "unsigned int *Kit_DsdTruthComputeNodeTwo_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int, int, unsigned int *)"
                   );
    }
    if (((uint)*pObj_00 >> 6 & 7) == 2) {
      __assert_fail("pObj->Type != KIT_DSD_VAR",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                    ,0x368,
                    "unsigned int *Kit_DsdTruthComputeNodeTwo_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int, int, unsigned int *)"
                   );
    }
    uSuppCur = 0;
    local_134 = 0;
    for (fCompl = 0; fCompl < (uint)*pObj_00 >> 0x1a; fCompl = fCompl + 1) {
      uVar4 = Kit_DsdLitSupport(pNtk,(uint)*(ushort *)(&pObj_00[1].field_0x0 + (ulong)fCompl * 2));
      if ((uSupp & uVar4) != 0) {
        uSuppCur = uSuppCur + 1;
        local_134 = uVar4 | local_134;
      }
    }
    if ((uSuppCur == 0) || (uSuppCur == (uint)*pObj_00 >> 0x1a)) {
      p_local = (Kit_DsdMan_t *)Kit_DsdTruthComputeNodeOne_rec(p,pNtk,Id,0);
    }
    else {
      if (local_134 == (local_134 & uSupp)) {
        if (local_134 != (local_134 & uSupp)) {
          __assert_fail("uSuppFan == (uSuppFan & uSupp)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                        ,0x3a3,
                        "unsigned int *Kit_DsdTruthComputeNodeTwo_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int, int, unsigned int *)"
                       );
        }
        if ((uint)*pObj_00 >> 0x1a <= uSuppCur) {
          __assert_fail("nPartial < pObj->nFans",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                        ,0x3a4,
                        "unsigned int *Kit_DsdTruthComputeNodeTwo_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int, int, unsigned int *)"
                       );
        }
        for (fCompl = 0; fCompl < (uint)*pObj_00 >> 0x1a; fCompl = fCompl + 1) {
          uVar1 = *(ushort *)(&pObj_00[1].field_0x0 + (ulong)fCompl * 2);
          iVar3 = Abc_Lit2Var((uint)uVar1);
          puVar5 = Kit_DsdTruthComputeNodeOne_rec(p,pNtk,iVar3,0);
          pTruthFans[(ulong)fCompl - 1] = puVar5;
          uVar4 = Kit_DsdLitSupport(pNtk,(uint)uVar1);
          pfBoundSet[(ulong)fCompl - 2] = (uint)((uSupp & uVar4) != 0);
        }
        if (((uint)*pObj_00 >> 6 & 7) == 3) {
          Kit_TruthIthVar((uint *)p_local,(uint)pNtk->nVars,iVar);
          Kit_TruthFill(pTruthDec,(uint)pNtk->nVars);
          for (fCompl = 0; fCompl < (uint)*pObj_00 >> 0x1a; fCompl = fCompl + 1) {
            if (pfBoundSet[(ulong)fCompl - 2] == 0) {
              puVar5 = pTruthFans[(ulong)fCompl - 1];
              uVar1 = pNtk->nVars;
              iVar3 = Abc_LitIsCompl((uint)*(ushort *)(&pObj_00[1].field_0x0 + (ulong)fCompl * 2));
              Kit_TruthAndPhase((uint *)p_local,(uint *)p_local,puVar5,(uint)uVar1,0,iVar3);
            }
            else {
              puVar5 = pTruthFans[(ulong)fCompl - 1];
              uVar1 = pNtk->nVars;
              iVar3 = Abc_LitIsCompl((uint)*(ushort *)(&pObj_00[1].field_0x0 + (ulong)fCompl * 2));
              Kit_TruthAndPhase(pTruthDec,pTruthDec,puVar5,(uint)uVar1,0,iVar3);
            }
          }
          return (uint *)p_local;
        }
        if (((uint)*pObj_00 >> 6 & 7) == 4) {
          Kit_TruthIthVar((uint *)p_local,(uint)pNtk->nVars,iVar);
          Kit_TruthClear(pTruthDec,(uint)pNtk->nVars);
          uSuppFan = 0;
          for (fCompl = 0; fCompl < (uint)*pObj_00 >> 0x1a; fCompl = fCompl + 1) {
            uVar4 = Abc_LitIsCompl((uint)*(ushort *)(&pObj_00[1].field_0x0 + (ulong)fCompl * 2));
            uSuppFan = uVar4 ^ uSuppFan;
            if (pfBoundSet[(ulong)fCompl - 2] == 0) {
              Kit_TruthXor((uint *)p_local,(uint *)p_local,pTruthFans[(ulong)fCompl - 1],
                           (uint)pNtk->nVars);
            }
            else {
              Kit_TruthXor(pTruthDec,pTruthDec,pTruthFans[(ulong)fCompl - 1],(uint)pNtk->nVars);
            }
          }
          if (uSuppFan == 0) {
            return (uint *)p_local;
          }
          Kit_TruthNot((uint *)p_local,(uint *)p_local,(uint)pNtk->nVars);
          return (uint *)p_local;
        }
        if (((uint)*pObj_00 >> 6 & 7) != 5) {
          __assert_fail("pObj->Type == KIT_DSD_PRIME",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                        ,0x3cc,
                        "unsigned int *Kit_DsdTruthComputeNodeTwo_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int, int, unsigned int *)"
                       );
        }
        if (uSuppCur != 1) {
          __assert_fail("nPartial == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                        ,0x3cd,
                        "unsigned int *Kit_DsdTruthComputeNodeTwo_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int, int, unsigned int *)"
                       );
        }
        fCompl = 0;
        while ((fCompl < (uint)*pObj_00 >> 0x1a && (pfBoundSet[(ulong)fCompl - 2] == 0))) {
          fCompl = fCompl + 1;
        }
        if ((uint)*pObj_00 >> 0x1a <= fCompl) {
          __assert_fail("i < pObj->nFans",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                        ,0x3d3,
                        "unsigned int *Kit_DsdTruthComputeNodeTwo_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int, int, unsigned int *)"
                       );
        }
        Kit_TruthCopy(pTruthDec,pTruthFans[(ulong)fCompl - 1],(uint)pNtk->nVars);
        Kit_TruthIthVar(pTruthFans[(ulong)fCompl - 1],(uint)pNtk->nVars,iVar);
      }
      else {
        if (uSuppCur != 1) {
          __assert_fail("nPartial == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                        ,0x380,
                        "unsigned int *Kit_DsdTruthComputeNodeTwo_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int, int, unsigned int *)"
                       );
        }
        for (fCompl = 0; fCompl < (uint)*pObj_00 >> 0x1a; fCompl = fCompl + 1) {
          uVar4 = (uint)*(ushort *)(&pObj_00[1].field_0x0 + (ulong)fCompl * 2);
          uVar2 = Kit_DsdLitSupport(pNtk,uVar4);
          if ((uSupp & uVar2) == 0) {
            iVar3 = Abc_Lit2Var(uVar4);
            puVar5 = Kit_DsdTruthComputeNodeOne_rec(p,pNtk,iVar3,0);
            pTruthFans[(ulong)fCompl - 1] = puVar5;
          }
          else {
            iVar3 = Abc_Lit2Var(uVar4);
            puVar5 = Kit_DsdTruthComputeNodeTwo_rec(p,pNtk,iVar3,uSupp,iVar,pTruthDec);
            pTruthFans[(ulong)fCompl - 1] = puVar5;
          }
        }
        if (((uint)*pObj_00 >> 6 & 7) == 3) {
          Kit_TruthFill((uint *)p_local,(uint)pNtk->nVars);
          for (fCompl = 0; fCompl < (uint)*pObj_00 >> 0x1a; fCompl = fCompl + 1) {
            puVar5 = pTruthFans[(ulong)fCompl - 1];
            uVar1 = pNtk->nVars;
            iVar3 = Abc_LitIsCompl((uint)*(ushort *)(&pObj_00[1].field_0x0 + (ulong)fCompl * 2));
            Kit_TruthAndPhase((uint *)p_local,(uint *)p_local,puVar5,(uint)uVar1,0,iVar3);
          }
          return (uint *)p_local;
        }
        if (((uint)*pObj_00 >> 6 & 7) == 4) {
          Kit_TruthClear((uint *)p_local,(uint)pNtk->nVars);
          uSuppFan = 0;
          for (fCompl = 0; fCompl < (uint)*pObj_00 >> 0x1a; fCompl = fCompl + 1) {
            uVar4 = Abc_LitIsCompl((uint)*(ushort *)(&pObj_00[1].field_0x0 + (ulong)fCompl * 2));
            uSuppFan = uVar4 ^ uSuppFan;
            Kit_TruthXor((uint *)p_local,(uint *)p_local,pTruthFans[(ulong)fCompl - 1],
                         (uint)pNtk->nVars);
          }
          if (uSuppFan == 0) {
            return (uint *)p_local;
          }
          Kit_TruthNot((uint *)p_local,(uint *)p_local,(uint)pNtk->nVars);
          return (uint *)p_local;
        }
        if (((uint)*pObj_00 >> 6 & 7) != 5) {
          __assert_fail("pObj->Type == KIT_DSD_PRIME",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                        ,0x39f,
                        "unsigned int *Kit_DsdTruthComputeNodeTwo_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int, int, unsigned int *)"
                       );
        }
      }
      for (fCompl = 0; fCompl < (uint)*pObj_00 >> 0x1a; fCompl = fCompl + 1) {
        iVar3 = Abc_LitIsCompl((uint)*(ushort *)(&pObj_00[1].field_0x0 + (ulong)fCompl * 2));
        if (iVar3 != 0) {
          Kit_TruthNot(pTruthFans[(ulong)fCompl - 1],pTruthFans[(ulong)fCompl - 1],(uint)pNtk->nVars
                      );
        }
      }
      dd = p->dd;
      puVar5 = Kit_DsdObjTruth(pObj_00);
      puVar5 = Kit_TruthCompose(dd,puVar5,(uint)*pObj_00 >> 0x1a,&pTruthTemp,(uint)pNtk->nVars,
                                p->vTtBdds,p->vNodes);
      Kit_TruthCopy((uint *)p_local,puVar5,(uint)pNtk->nVars);
    }
  }
  return (uint *)p_local;
}

Assistant:

unsigned * Kit_DsdTruthComputeNodeTwo_rec( Kit_DsdMan_t * p, Kit_DsdNtk_t * pNtk, int Id, unsigned uSupp, int iVar, unsigned * pTruthDec )
{
    Kit_DsdObj_t * pObj;
    int pfBoundSet[16];
    unsigned * pTruthRes, * pTruthFans[16], * pTruthTemp;
    unsigned i, iLit, fCompl, nPartial, uSuppFan, uSuppCur;
//    unsigned m, nMints, * pTruthPrime, * pTruthMint; 
    assert( uSupp > 0 );

    // get the node with this ID
    pObj = Kit_DsdNtkObj( pNtk, Id );
    pTruthRes = (unsigned *)Vec_PtrEntry( p->vTtNodes, Id );
    if ( pObj == NULL )
    {
        assert( Id < pNtk->nVars );
        return pTruthRes;
    }
    assert( pObj->Type != KIT_DSD_CONST1 );
    assert( pObj->Type != KIT_DSD_VAR );

    // count the number of intersecting fanins 
    // collect the total support of the intersecting fanins
    nPartial = 0;
    uSuppFan = 0;
    Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
    {
        uSuppCur = Kit_DsdLitSupport(pNtk, iLit);
        if ( uSupp & uSuppCur )
        {
            nPartial++;
            uSuppFan |= uSuppCur;
        }
    }

    // if there is no intersection, or full intersection, use simple procedure
    if ( nPartial == 0 || nPartial == pObj->nFans )
        return Kit_DsdTruthComputeNodeOne_rec( p, pNtk, Id, 0 );

    // if support of the component includes some other variables
    // we need to continue constructing it as usual by the two-function procedure
    if ( uSuppFan != (uSuppFan & uSupp) )
    {
        assert( nPartial == 1 );
//        return Kit_DsdTruthComputeNodeTwo_rec( p, pNtk, Id, uSupp, iVar, pTruthDec );
        Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
        {
            if ( uSupp & Kit_DsdLitSupport(pNtk, iLit) )
                pTruthFans[i] = Kit_DsdTruthComputeNodeTwo_rec( p, pNtk, Abc_Lit2Var(iLit), uSupp, iVar, pTruthDec );
            else
                pTruthFans[i] = Kit_DsdTruthComputeNodeOne_rec( p, pNtk, Abc_Lit2Var(iLit), 0 );
        }

        // create composition/decomposition functions
        if ( pObj->Type == KIT_DSD_AND )
        {
            Kit_TruthFill( pTruthRes, pNtk->nVars );
            Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
                Kit_TruthAndPhase( pTruthRes, pTruthRes, pTruthFans[i], pNtk->nVars, 0, Abc_LitIsCompl(iLit) );
            return pTruthRes;
        }
        if ( pObj->Type == KIT_DSD_XOR )
        {
            Kit_TruthClear( pTruthRes, pNtk->nVars );
            fCompl = 0;
            Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
            {
                fCompl ^= Abc_LitIsCompl(iLit);
                Kit_TruthXor( pTruthRes, pTruthRes, pTruthFans[i], pNtk->nVars );
            }
            if ( fCompl )
                Kit_TruthNot( pTruthRes, pTruthRes, pNtk->nVars );
            return pTruthRes;
        }
        assert( pObj->Type == KIT_DSD_PRIME );
    }
    else
    {
        assert( uSuppFan == (uSuppFan & uSupp) );
        assert( nPartial < pObj->nFans );
        // the support of the insecting component(s) is contained in the bound-set
        // and yet there are components that are not contained in the bound set

        // solve the fanins and collect info, which components belong to the bound set
        Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
        {
            pTruthFans[i] = Kit_DsdTruthComputeNodeOne_rec( p, pNtk, Abc_Lit2Var(iLit), 0 );
            pfBoundSet[i] = (int)((uSupp & Kit_DsdLitSupport(pNtk, iLit)) > 0);
        }

        // create composition/decomposition functions
        if ( pObj->Type == KIT_DSD_AND )
        {
            Kit_TruthIthVar( pTruthRes, pNtk->nVars, iVar );
            Kit_TruthFill( pTruthDec, pNtk->nVars );
            Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
                if ( pfBoundSet[i] )
                    Kit_TruthAndPhase( pTruthDec, pTruthDec, pTruthFans[i], pNtk->nVars, 0, Abc_LitIsCompl(iLit) );
                else
                    Kit_TruthAndPhase( pTruthRes, pTruthRes, pTruthFans[i], pNtk->nVars, 0, Abc_LitIsCompl(iLit) );
            return pTruthRes;
        }
        if ( pObj->Type == KIT_DSD_XOR )
        {
            Kit_TruthIthVar( pTruthRes, pNtk->nVars, iVar );
            Kit_TruthClear( pTruthDec, pNtk->nVars );
            fCompl = 0;
            Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
            {
                fCompl ^= Abc_LitIsCompl(iLit);
                if ( pfBoundSet[i] )
                    Kit_TruthXor( pTruthDec, pTruthDec, pTruthFans[i], pNtk->nVars );
                else
                    Kit_TruthXor( pTruthRes, pTruthRes, pTruthFans[i], pNtk->nVars );
            }
            if ( fCompl )
                Kit_TruthNot( pTruthRes, pTruthRes, pNtk->nVars );
            return pTruthRes;
        }
        assert( pObj->Type == KIT_DSD_PRIME );
        assert( nPartial == 1 );

        // find the only non-empty component
        Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
            if ( pfBoundSet[i] )
                break;
        assert( i < pObj->nFans );

        // save this component as the decomposed function
        Kit_TruthCopy( pTruthDec, pTruthFans[i], pNtk->nVars );
        // set the corresponding component to be the new variable
        Kit_TruthIthVar( pTruthFans[i], pNtk->nVars, iVar );
    }
/*
    // get the truth table of the prime node
    pTruthPrime = Kit_DsdObjTruth( pObj );
    // get storage for the temporary minterm
    pTruthMint = Vec_PtrEntry(p->vTtNodes, pNtk->nVars + pNtk->nNodes);
    // go through the minterms
    nMints = (1 << pObj->nFans);
    Kit_TruthClear( pTruthRes, pNtk->nVars );
    for ( m = 0; m < nMints; m++ )
    {
        if ( !Kit_TruthHasBit(pTruthPrime, m) )
            continue;
        Kit_TruthFill( pTruthMint, pNtk->nVars );
        Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
            Kit_TruthAndPhase( pTruthMint, pTruthMint, pTruthFans[i], pNtk->nVars, 0, ((m & (1<<i)) == 0) ^ Abc_LitIsCompl(iLit) );
        Kit_TruthOr( pTruthRes, pTruthRes, pTruthMint, pNtk->nVars );
    }
*/
//    Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
//        assert( !Abc_LitIsCompl(iLit) );
    Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
        if ( Abc_LitIsCompl(iLit) )
            Kit_TruthNot( pTruthFans[i], pTruthFans[i], pNtk->nVars );
    pTruthTemp = Kit_TruthCompose( p->dd, Kit_DsdObjTruth(pObj), pObj->nFans, pTruthFans, pNtk->nVars, p->vTtBdds, p->vNodes );
    Kit_TruthCopy( pTruthRes, pTruthTemp, pNtk->nVars );
    return pTruthRes;
}